

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

ArgString * __thiscall
Potassco::ArgString::get<Potassco::Set<Clasp::HeuParams::DomPref>>
          (ArgString *this,Set<Clasp::HeuParams::DomPref> *x)

{
  uint *puVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  KV *pKVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  Set<Clasp::HeuParams::DomPref> local_5c;
  char *next;
  Set<Clasp::HeuParams::DomPref> *local_50;
  ArgString *local_48;
  Span<Potassco::KV> local_40;
  
  pcVar9 = this->in;
  if (pcVar9 != (char *)0x0) {
    cVar2 = *pcVar9;
    cVar3 = this->skip;
    uVar8 = 0;
    iVar4 = Potassco::xconvert(pcVar9 + (cVar2 == cVar3),&local_5c.val,&next,0);
    if (iVar4 == 0) {
      next = "";
      local_5c.val = 0;
      uVar8 = 0;
      pcVar9 = pcVar9 + (cVar2 == cVar3);
      local_50 = x;
      local_48 = this;
      while( true ) {
        local_40.first = (KV *)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map;
        local_40.size = 6;
        pKVar5 = findValue(&local_40,pcVar9 + (*next == ','),&next,",");
        this = local_48;
        x = local_50;
        if (pKVar5 == (KV *)0x0) break;
        local_5c.val = local_5c.val | pKVar5->value;
        uVar8 = uVar8 + 1;
        pcVar9 = next;
      }
    }
    else {
      lVar6 = 8;
      uVar7 = 0;
      while ((lVar6 != 0x68 && (uVar8 == 0))) {
        puVar1 = (uint *)((long)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map + lVar6);
        uVar7 = uVar7 | *puVar1;
        lVar6 = lVar6 + 0x10;
        uVar8 = (uint)((local_5c.val & ~uVar7) == 0 && local_5c.val != 0 || local_5c.val == *puVar1)
        ;
      }
    }
    if (uVar8 == 0) {
      next = (char *)0x0;
    }
    else {
      x->val = local_5c.val;
    }
    this->in = next;
    this->skip = ',';
  }
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}